

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O1

void __thiscall FParser::SF_SpawnMissile(FParser *this)

{
  PClassActor *type;
  AActor *source;
  AActor *dest;
  svalue_t local_30;
  
  if (2 < this->t_argc) {
    svalue_t::svalue_t(&local_30,this->t_argv + 2);
    type = T_GetMobjType(&local_30);
    FString::~FString(&local_30.string);
    if (type != (PClassActor *)0x0) {
      source = actorvalue(this->t_argv);
      dest = actorvalue(this->t_argv + 1);
      if (dest != (AActor *)0x0 && source != (AActor *)0x0) {
        P_SpawnMissile(source,dest,type,(AActor *)0x0);
      }
    }
    return;
  }
  script_error("Insufficient parameters for \'%s\'\n",(this->t_func).Chars);
  return;
}

Assistant:

void FParser::SF_SpawnMissile()
{
	AActor *mobj;
	AActor *target;
	PClassActor * pclass;

	if (CheckArgs(3))
	{
		if (!(pclass=T_GetMobjType(t_argv[2]))) return;

		mobj = actorvalue(t_argv[0]);
		target = actorvalue(t_argv[1]);
		if (mobj && target) P_SpawnMissile(mobj, target, pclass);
	}
}